

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O2

void RDL_fillURFs(RDL_URFinfo *uInfo,RDL_cfURF *CFs)

{
  uint previouslyAlloced;
  long lVar1;
  uint RCFIdx;
  void *__ptr;
  void *pvVar2;
  RDL_cfam ***URFs;
  uint *puVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint local_6c;
  
  uVar5 = (ulong)uInfo->nofWeights;
  __ptr = malloc(uVar5 * 8);
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pvVar2 = malloc((ulong)uInfo->nofProtos[uVar6]);
    *(void **)((long)__ptr + uVar6 * 8) = pvVar2;
  }
  for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    for (uVar5 = 0; uVar5 < uInfo->nofProtos[uVar6]; uVar5 = uVar5 + 1) {
      *(undefined1 *)(*(long *)((long)__ptr + uVar6 * 8) + uVar5) = 0;
    }
    uVar5 = (ulong)uInfo->nofWeights;
  }
  uVar7 = (ulong)uInfo->nofURFs;
  URFs = (RDL_cfam ***)malloc(uVar7 * 8);
  puVar3 = (uint *)malloc(uVar7 * 4);
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    puVar3[uVar6] = 0;
  }
  local_6c = 0;
  for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    puVar4 = uInfo->nofProtos;
    for (uVar5 = 0; uVar5 < puVar4[uVar6]; uVar5 = uVar5 + 1) {
      if ((uInfo->URFrel[uVar6][uVar5][uVar5] == '\x01') &&
         (lVar1 = *(long *)((long)__ptr + uVar6 * 8), *(char *)(lVar1 + uVar5) == '\0')) {
        for (uVar7 = uVar5; uVar7 < puVar4[uVar6]; uVar7 = uVar7 + 1) {
          if (uInfo->URFrel[uVar6][uVar5][uVar7] == '\x01') {
            RCFIdx = RDL_idxWeight(uInfo,(uint)uVar6,(uint)uVar7);
            previouslyAlloced = puVar3[local_6c];
            RDL_addRCFtoURF(RCFIdx,local_6c,previouslyAlloced,URFs,CFs);
            puVar3[local_6c] = previouslyAlloced + 1;
            *(undefined1 *)(lVar1 + uVar7) = 1;
            puVar4 = uInfo->nofProtos;
          }
        }
        local_6c = local_6c + 1;
      }
    }
    uVar5 = (ulong)uInfo->nofWeights;
  }
  for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    free(*(void **)((long)__ptr + uVar6 * 8));
    uVar5 = (ulong)uInfo->nofWeights;
  }
  free(__ptr);
  uInfo->URFs = URFs;
  uInfo->nofCFsPerURF = puVar3;
  return;
}

Assistant:

void RDL_fillURFs(RDL_URFinfo *uInfo, RDL_cfURF *CFs)
{
  RDL_cfam ***URFs;
  unsigned *nofRCFs;
  unsigned currURFIdx=0;
  unsigned i,j,k;
  char **alreadyInURF; /*for each weight: an array storing if a RCF is already
                        part of a URF*/

  alreadyInURF = malloc(uInfo->nofWeights * sizeof(*alreadyInURF));
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    alreadyInURF[i] = malloc(uInfo->nofProtos[i] * sizeof(*alreadyInURF[i]));
  }
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      alreadyInURF[i][j] = 0;
    }
  }

  URFs = malloc(uInfo->nofURFs * sizeof(*URFs));
  nofRCFs = malloc(uInfo->nofURFs * sizeof(*nofRCFs));
  for(i=0; i<uInfo->nofURFs; ++i)
  {
    nofRCFs[i] = 0;
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      /*if this family is not already part of a URF*/
      if((uInfo->URFrel[i][j][j] == 1) && (alreadyInURF[i][j] == 0))
      {
        for(k=j; k<uInfo->nofProtos[i]; ++k)
        {
          if(uInfo->URFrel[i][j][k] == 1)
          {
            /*add to current URF the CFs with the given Idx*/
            RDL_addRCFtoURF(RDL_idxWeight(uInfo,i,k),currURFIdx,
                            nofRCFs[currURFIdx],URFs,CFs);
            ++nofRCFs[currURFIdx];
            alreadyInURF[i][k] = 1;
          }
        }
        ++currURFIdx;
      }
    }
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(alreadyInURF[i]);
  }
  free(alreadyInURF);
  uInfo->URFs=URFs;
  uInfo->nofCFsPerURF = nofRCFs;
}